

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status_internal.h
# Opt level: O2

void __thiscall
absl::lts_20250127::status_internal::StatusRep::StatusRep
          (StatusRep *this,StatusCode code_arg,string_view message_arg,
          unique_ptr<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>,_std::default_delete<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_>_>
          *payloads_arg)

{
  allocator<char> local_21;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  local_20._M_str = message_arg._M_str;
  local_20._M_len = message_arg._M_len;
  (this->ref_).super___atomic_base<int>._M_i = 1;
  this->code_ = code_arg;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&this->message_,&local_20,&local_21);
  (this->payloads_)._M_t.
  super___uniq_ptr_impl<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>,_std::default_delete<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_*,_std::default_delete<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_>_>
  .
  super__Head_base<0UL,_absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_*,_false>
  ._M_head_impl =
       (payloads_arg->_M_t).
       super___uniq_ptr_impl<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>,_std::default_delete<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_*,_std::default_delete<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_>_>
       .
       super__Head_base<0UL,_absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_*,_false>
       ._M_head_impl;
  (payloads_arg->_M_t).
  super___uniq_ptr_impl<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>,_std::default_delete<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_*,_std::default_delete<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_>_>
  .
  super__Head_base<0UL,_absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_*,_false>
  ._M_head_impl =
       (InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
        *)0x0;
  return;
}

Assistant:

StatusRep(absl::StatusCode code_arg, absl::string_view message_arg,
            std::unique_ptr<status_internal::Payloads> payloads_arg)
      : ref_(int32_t{1}),
        code_(code_arg),
        message_(message_arg),
        payloads_(std::move(payloads_arg)) {}